

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BerdyHelper.cpp
# Opt level: O0

IndexRange __thiscall
iDynTree::BerdyHelper::getRangeDOFVariable
          (BerdyHelper *this,BerdyDynamicVariablesTypes dynamicVariableType,DOFIndex idx)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  TraversalIndex idx_00;
  long in_RDX;
  BerdyDynamicVariablesTypes in_ESI;
  BerdyHelper *in_RDI;
  int totalSizeOfJointVariables;
  int totalSizeOfLinkVariables;
  IndexRange ret;
  undefined4 in_stack_ffffffffffffffb0;
  Model *in_stack_ffffffffffffffc0;
  IndexRange local_10;
  
  bVar1 = isDOFBerdyDynamicVariable(in_ESI);
  if (bVar1) {
    if ((in_RDI->m_options).berdyVariant == ORIGINAL_BERDY_FIXED_BASE) {
      idx_00 = getTraversalIndexFromJointIndex
                         (in_stack_ffffffffffffffc0,(Traversal *)in_RDI,
                          CONCAT44(in_ESI,in_stack_ffffffffffffffb0));
      local_10 = getRangeOriginalBerdyFixedBase(in_RDI,in_ESI,idx_00);
    }
    else {
      iVar2 = iDynTree::Model::getNrOfLinks();
      iVar3 = iDynTree::Model::getNrOfJoints();
      if (in_ESI == DOF_ACCELERATION) {
        local_10.size = 1;
        local_10.offset = (iVar2 * 0xc + iVar3 * 6) + in_RDX;
      }
      else {
        local_10 = (IndexRange)iDynTree::IndexRange::InvalidRange();
      }
    }
  }
  else {
    local_10 = (IndexRange)iDynTree::IndexRange::InvalidRange();
  }
  return local_10;
}

Assistant:

IndexRange BerdyHelper::getRangeDOFVariable(BerdyDynamicVariablesTypes dynamicVariableType, DOFIndex idx) const
{
    if( !isDOFBerdyDynamicVariable(dynamicVariableType) )
    {
        return IndexRange::InvalidRange();
    }

    if (m_options.berdyVariant == ORIGINAL_BERDY_FIXED_BASE)
    {
        // For a model with all 1-dofs, dof index and joint index matches
        return getRangeOriginalBerdyFixedBase(dynamicVariableType,
                                              getTraversalIndexFromJointIndex(m_model, m_dynamicsTraversal, idx));
    }
    else
    {
        IndexRange ret;
        assert(m_options.berdyVariant == BERDY_FLOATING_BASE);
        assert(m_options.includeAllNetExternalWrenchesAsDynamicVariables);

        int totalSizeOfLinkVariables  = 12*m_model.getNrOfLinks();
        int totalSizeOfJointVariables = 6*m_model.getNrOfJoints();

        switch (dynamicVariableType)
        {
            case DOF_ACCELERATION:
                ret.offset = totalSizeOfLinkVariables + totalSizeOfJointVariables + idx;
                ret.size = 1;
                break;
            default:
                assert(false);
                ret = IndexRange::InvalidRange();
                break;
        }

        return ret;
    }
}